

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::~GenericSchemaDocument
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (this->schemaMap_).stack_;
  pcVar2 = (this->schemaMap_).stackTop_;
  while( true ) {
    if (pcVar2 == pcVar1) {
      if (this->typeless_ !=
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *)0x0) {
        internal::
        Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
        ::~Schema(this->typeless_);
        free(this->typeless_);
      }
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->uri_);
      (this->uri_).data_.n = (Number)0x0;
      (this->uri_).data_.s.str = (Ch *)0x0;
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->error_);
      (this->error_).data_.n = (Number)0x0;
      (this->error_).data_.s.str = (Ch *)0x0;
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                (&this->currentError_);
      (this->currentError_).data_.n = (Number)0x0;
      (this->currentError_).data_.s.str = (Ch *)0x0;
      if (this->ownAllocator_ != (CrtAllocator *)0x0) {
        operator_delete(this->ownAllocator_,1);
      }
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                (&this->currentError_);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->error_);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&this->docId_);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->uri_);
      internal::Stack<rapidjson::CrtAllocator>::Destroy(&this->schemaRef_);
      internal::Stack<rapidjson::CrtAllocator>::Destroy(&this->schemaMap_);
      return;
    }
    if ((ulong)((long)pcVar2 - (long)pcVar1) < 0x48) break;
    (this->schemaMap_).stackTop_ = pcVar2 + -0x48;
    SchemaEntry::~SchemaEntry((SchemaEntry *)(pcVar2 + -0x48));
    pcVar1 = (this->schemaMap_).stack_;
    pcVar2 = (this->schemaMap_).stackTop_;
  }
  __assert_fail("GetSize() >= count * sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x8b,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>::SchemaEntry]"
               );
}

Assistant:

~GenericSchemaDocument() {
        while (!schemaMap_.Empty())
            schemaMap_.template Pop<SchemaEntry>(1)->~SchemaEntry();

        if (typeless_) {
            typeless_->~SchemaType();
            Allocator::Free(typeless_);
        }

        // these may contain some allocator data so clear before deleting ownAllocator_
        uri_.SetNull();
        error_.SetNull();
        currentError_.SetNull();

        RAPIDJSON_DELETE(ownAllocator_);
    }